

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateSource
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  int32 key;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  FieldGenerator *pFVar9;
  FieldDescriptor **ppFVar10;
  ulong uVar11;
  mapped_type *pmVar12;
  long *plVar13;
  Descriptor *pDVar14;
  char *pcVar15;
  ulong *puVar16;
  int i;
  unsigned_long i_00;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar17;
  Descriptor *extraout_RDX_08;
  ulong uVar18;
  pointer ppOVar19;
  undefined8 *puVar20;
  Descriptor *descriptor;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  long lVar21;
  FieldDescriptor **ppFVar22;
  undefined8 *puVar23;
  long lVar24;
  pointer ppEVar25;
  pointer ppMVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  string suffix_added;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  scoped_array<const_google::protobuf::FieldDescriptor_*> size_order_fields;
  string field_description_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_flags;
  TextFormatDecodeData text_format_decode_data;
  string local_1a8;
  char local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  FieldGeneratorMap *local_160;
  undefined1 local_158 [16];
  long local_148;
  string *local_138;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_130;
  undefined1 local_128 [32];
  _Base_ptr local_108;
  size_t local_100;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_f8;
  int local_f0;
  uint local_ec;
  key_type local_e8;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  TextFormatDecodeData local_88;
  string local_70;
  string local_50;
  long lVar29;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) != '\0') goto LAB_0027ed69;
  local_138 = &this->class_name_;
  io::Printer::Print(printer,"#pragma mark - $classname$\n\n","classname",local_138);
  if ((this->deprecated_attribute_)._M_string_length != 0) {
    io::Printer::Print(printer,
                       "#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n\n"
                      );
  }
  io::Printer::Print(printer,"@implementation $classname$\n\n","classname",local_138);
  for (ppOVar19 = (this->oneof_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppOVar19 !=
      (this->oneof_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppOVar19 = ppOVar19 + 1) {
    OneofGenerator::GeneratePropertyImplementation(*ppOVar19,printer);
  }
  pDVar14 = this->descriptor_;
  if (0 < *(int *)(pDVar14 + 0x2c)) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      pFVar9 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar14 + 0x30) + lVar21));
      (*pFVar9->_vptr_FieldGenerator[4])(pFVar9,printer);
      lVar24 = lVar24 + 1;
      pDVar14 = this->descriptor_;
      lVar21 = lVar21 + 0xa8;
    } while (lVar24 < *(int *)(pDVar14 + 0x2c));
  }
  local_130.array_ = anon_unknown_7::SortFieldsByNumber(pDVar14);
  pDVar14 = this->descriptor_;
  iVar8 = *(int *)(pDVar14 + 0x2c);
  uVar18 = (ulong)iVar8;
  uVar11 = 0xffffffffffffffff;
  if (-1 < (long)uVar18) {
    uVar11 = uVar18 * 8;
  }
  ppFVar10 = (FieldDescriptor **)operator_new__(uVar11);
  auVar4 = _DAT_00352680;
  if (0 < iVar8) {
    lVar24 = *(long *)(pDVar14 + 0x30);
    lVar21 = uVar18 - 1;
    auVar27._8_4_ = (int)lVar21;
    auVar27._0_8_ = lVar21;
    auVar27._12_4_ = (int)((ulong)lVar21 >> 0x20);
    lVar21 = 0;
    auVar27 = auVar27 ^ _DAT_00352680;
    auVar28 = _DAT_00352670;
    do {
      auVar30 = auVar28 ^ auVar4;
      if ((bool)(~(auVar30._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar30._0_4_ ||
                  auVar27._4_4_ < auVar30._4_4_) & 1)) {
        *(long *)((long)ppFVar10 + lVar21) = lVar24;
      }
      if ((auVar30._12_4_ != auVar27._12_4_ || auVar30._8_4_ <= auVar27._8_4_) &&
          auVar30._12_4_ <= auVar27._12_4_) {
        *(long *)((long)ppFVar10 + lVar21 + 8) = lVar24 + 0xa8;
      }
      lVar29 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar29 + 2;
      lVar21 = lVar21 + 0x10;
      lVar24 = lVar24 + 0x150;
    } while ((ulong)(iVar8 + 1U >> 1) << 4 != lVar21);
  }
  if (iVar8 != 0) {
    lVar21 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
              (ppFVar10,ppFVar10 + uVar18,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    if (iVar8 < 0x11) {
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                (ppFVar10,ppFVar10 + uVar18);
    }
    else {
      ppFVar22 = ppFVar10 + 0x10;
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                (ppFVar10,ppFVar22);
      lVar21 = uVar18 * 8 - 0x80;
      do {
        std::
        __unguarded_linear_insert<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                  (ppFVar22);
        ppFVar22 = ppFVar22 + 1;
        lVar21 = lVar21 + -8;
      } while (lVar21 != 0);
    }
  }
  local_158 = (undefined1  [16])0x0;
  local_148 = 0;
  pDVar14 = this->descriptor_;
  local_f8.array_ = ppFVar10;
  if (0 < *(int *)(pDVar14 + 0x68)) {
    lVar24 = 0;
    lVar21 = 0;
    do {
      local_128._0_8_ = *(long *)(pDVar14 + 0x70) + lVar24;
      std::
      vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
      ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
                ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                  *)local_158,(ExtensionRange **)local_128);
      lVar21 = lVar21 + 1;
      pDVar14 = this->descriptor_;
      lVar24 = lVar24 + 8;
    } while (lVar21 < *(int *)(pDVar14 + 0x68));
    uVar17 = local_158._0_8_;
    uVar5 = local_158._8_8_;
    if (local_158._0_8_ != local_158._8_8_) {
      lVar24 = local_158._8_8_ - local_158._0_8_;
      uVar11 = lVar24 >> 3;
      lVar21 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                (local_158._0_8_,local_158._8_8_,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar24 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (uVar17,uVar5);
      }
      else {
        puVar23 = (undefined8 *)(uVar17 + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (uVar17,puVar23);
        for (; puVar23 != (undefined8 *)uVar5; puVar23 = puVar23 + 1) {
          piVar2 = (int *)puVar23[-1];
          piVar3 = (int *)*puVar23;
          iVar8 = *piVar3;
          iVar1 = *piVar2;
          puVar20 = puVar23;
          while (iVar8 < iVar1) {
            *puVar20 = piVar2;
            piVar2 = (int *)puVar20[-2];
            puVar20 = puVar20 + -1;
            iVar1 = *piVar2;
          }
          *puVar20 = piVar3;
        }
      }
    }
  }
  local_160 = &this->field_generators_;
  iVar8 = FieldGeneratorMap::CalculateHasBits(local_160);
  uVar11 = 1;
  if (0x1f < (long)iVar8 + 0x1fU) {
    uVar11 = (long)iVar8 + 0x1fU >> 5;
  }
  for (ppOVar19 = (this->oneof_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppOVar19 !=
      (this->oneof_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppOVar19 = ppOVar19 + 1) {
    OneofGenerator::SetOneofIndexBase(*ppOVar19,(int)uVar11);
  }
  FieldGeneratorMap::SetOneofIndexBase(local_160,(int)uVar11);
  SimpleItoa_abi_cxx11_
            ((string *)local_128,(protobuf *)(uVar11 + (long)*(int *)(this->descriptor_ + 0x38)),
             i_00);
  io::Printer::Print(printer,
                     "\ntypedef struct $classname$__storage_ {\n  uint32_t _has_storage_[$sizeof_has_storage$];\n"
                     ,"classname",local_138,"sizeof_has_storage",(string *)local_128);
  if ((ExtensionRange *)local_128._0_8_ != (ExtensionRange *)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x2c)) {
    lVar21 = 0;
    do {
      ppFVar10 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                           (&local_f8,lVar21);
      pFVar9 = FieldGeneratorMap::get(local_160,*ppFVar10);
      (*pFVar9->_vptr_FieldGenerator[2])(pFVar9,printer);
      lVar21 = lVar21 + 1;
    } while (lVar21 < *(int *)(this->descriptor_ + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"} $classname$__storage_;\n\n","classname",local_138);
  io::Printer::Print(printer,
                     "// This method is threadsafe because it is initially called\n// in +initialize for each subclass.\n+ (GPBDescriptor *)descriptor {\n  static GPBDescriptor *descriptor = nil;\n  if (!descriptor) {\n"
                    );
  TextFormatDecodeData::TextFormatDecodeData(&local_88);
  iVar8 = *(int *)(this->descriptor_ + 0x2c);
  cVar6 = FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(local_160);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  pcVar15 = "GPBMessageFieldDescription";
  if ((bool)cVar6) {
    pcVar15 = "GPBMessageFieldDescriptionWithDefault";
  }
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,(ulong)pcVar15);
  if (0 < iVar8) {
    io::Printer::Print(printer,"    static $field_description_type$ fields[] = {\n",
                       "field_description_type",&local_c8);
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    local_181 = cVar6;
    local_f0 = iVar8;
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      lVar21 = 0;
      local_ec = (uint)(byte)cVar6;
      do {
        ppFVar10 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                             (&local_130,lVar21);
        pFVar9 = FieldGeneratorMap::get(local_160,*ppFVar10);
        FieldGenerator::GenerateFieldDescription(pFVar9,printer,SUB41(local_ec,0));
        bVar7 = FieldGenerator::needs_textformat_name_support(pFVar9);
        if (bVar7) {
          ppFVar10 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                               (&local_130,lVar21);
          key = *(int32 *)(*ppFVar10 + 0x38);
          FieldGenerator::variable_abi_cxx11_((string *)local_128,pFVar9,"name");
          FieldGenerator::variable_abi_cxx11_(&local_1a8,pFVar9,"raw_field_name");
          TextFormatDecodeData::AddString(&local_88,key,(string *)local_128,&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((ExtensionRange *)local_128._0_8_ != (ExtensionRange *)(local_128 + 0x10)) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)(this->descriptor_ + 0x2c));
    }
    io::Printer::Outdent(printer);
    iVar8 = local_f0;
    cVar6 = local_181;
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"    };\n");
  }
  local_128._24_8_ = local_128 + 8;
  local_128._8_4_ = _S_red;
  local_128._16_8_ = 0;
  local_100 = 0;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_108 = (_Base_ptr)local_128._24_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"classname","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_128,&local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"rootclassname","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_128,&local_1a8);
  std::__cxx11::string::_M_assign((string *)pmVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  pcVar15 = "NULL";
  if (0 < iVar8) {
    pcVar15 = "fields";
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fields","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_128,&local_1a8);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,(ulong)pcVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (iVar8 < 1) {
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fields_count","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_128,&local_1a8);
    std::__cxx11::string::_M_replace((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x397263);
    uVar17 = local_1a8.field_2._M_allocated_capacity;
    local_180._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_0027e738;
  }
  else {
    std::operator+(&local_180,"(uint32_t)(sizeof(fields) / sizeof(",&local_c8);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_180);
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    puVar16 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_1a8.field_2._M_allocated_capacity = *puVar16;
      local_1a8.field_2._8_8_ = plVar13[3];
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar16;
      local_1a8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_1a8._M_string_length = plVar13[1];
    *plVar13 = (long)puVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"fields_count","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_128,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    uVar17 = local_180.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
LAB_0027e738:
      operator_delete(local_180._M_dataplus._M_p,uVar17 + 1);
    }
  }
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (cVar6 != '\0') {
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"GPBDescriptorInitializationFlag_FieldsWithDefault","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x68) == '\x01') {
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"GPBDescriptorInitializationFlag_WireFormat","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
               &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  BuildFlagsString(&local_1a8,FLAGTYPE_DESCRIPTOR_INITIALIZATION,&local_a8);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"init_flags","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_128,&local_180);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_128,
                     "    GPBDescriptor *localDescriptor =\n        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n                                     rootClass:[$rootclassname$ class]\n                                          file:$rootclassname$_FileDescriptor()\n                                        fields:$fields$\n                                    fieldCount:$fields_count$\n                                   storageSize:sizeof($classname$__storage_)\n                                         flags:$init_flags$];\n"
                    );
  pDVar14 = extraout_RDX;
  if ((this->oneof_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->oneof_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::Printer::Print(printer,"    static const char *oneofs[] = {\n");
    ppOVar19 = (this->oneof_generators_).
               super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppOVar19 !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        OneofGenerator::DescriptorName_abi_cxx11_(&local_1a8,*ppOVar19);
        io::Printer::Print(printer,"      \"$name$\",\n","name",&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        ppOVar19 = ppOVar19 + 1;
      } while (ppOVar19 !=
               (this->oneof_generators_).
               super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      ppOVar19 = (this->oneof_generators_).
                 super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    }
    OneofGenerator::HasIndexAsString_abi_cxx11_(&local_1a8,*ppOVar19);
    io::Printer::Print(printer,
                       "    };\n    [localDescriptor setupOneofs:oneofs\n                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n                   firstHasIndex:$first_has_index$];\n"
                       ,"first_has_index",&local_1a8);
    pDVar14 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      pDVar14 = extraout_RDX_01;
    }
  }
  if (local_88.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    TextFormatDecodeData::Data_abi_cxx11_(&local_1a8,&local_88);
    io::Printer::Print(printer,
                       "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n    static const char *extraTextFormatInfo ="
                      );
    if (local_1a8._M_string_length != 0) {
      uVar11 = 0;
      do {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_1a8);
        CEscape(&local_e8,&local_70);
        EscapeTrigraphs(&local_180,&local_e8);
        io::Printer::Print(printer,"\n        \"$data$\"","data",&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        uVar11 = uVar11 + 0x28;
      } while (uVar11 < local_1a8._M_string_length);
    }
    io::Printer::Print(printer,
                       ";\n    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
                      );
    pDVar14 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      pDVar14 = extraout_RDX_03;
    }
  }
  if (local_158._8_8_ != local_158._0_8_) {
    io::Printer::Print(printer,"    static const GPBExtensionRange ranges[] = {\n");
    if (local_158._8_8_ != local_158._0_8_) {
      uVar11 = 0;
      uVar17 = extraout_RDX_04;
      do {
        SimpleItoa_abi_cxx11_
                  (&local_1a8,(protobuf *)(ulong)**(uint **)(local_158._0_8_ + uVar11 * 8),
                   (int)uVar17);
        SimpleItoa_abi_cxx11_
                  (&local_180,
                   (protobuf *)(ulong)*(uint *)(*(long *)(local_158._0_8_ + uVar11 * 8) + 4),i);
        io::Printer::Print(printer,"      { .start = $start$, .end = $end$ },\n","start",&local_1a8,
                           "end",&local_180);
        uVar17 = extraout_RDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          uVar17 = extraout_RDX_06;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          uVar17 = extraout_RDX_07;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)(local_158._8_8_ - local_158._0_8_) >> 3));
    }
    io::Printer::Print(printer,
                       "    };\n    [localDescriptor setupExtensionRanges:ranges\n                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n"
                      );
    pDVar14 = extraout_RDX_08;
  }
  descriptor = this->descriptor_;
  if (*(objectivec **)(descriptor + 0x18) != (objectivec *)0x0) {
    ClassName_abi_cxx11_(&local_1a8,*(objectivec **)(descriptor + 0x18),pDVar14);
    io::Printer::Print(printer,
                       "    [localDescriptor setupContainingMessageClassName:GPBStringifySymbol($parent_name$)];\n"
                       ,"parent_name",&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    descriptor = this->descriptor_;
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity =
       local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  ClassName(&local_50,descriptor,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8._M_string_length != 0) {
    io::Printer::Print(printer,"    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
                       "suffix",&local_1a8);
  }
  io::Printer::Print(printer,
                     "    NSAssert(descriptor == nil, @\"Startup recursed!\");\n    descriptor = localDescriptor;\n  }\n  return descriptor;\n}\n\n@end\n\n"
                    );
  if ((this->deprecated_attribute_)._M_string_length != 0) {
    io::Printer::Print(printer,"#pragma clang diagnostic pop\n\n");
  }
  pDVar14 = this->descriptor_;
  if (0 < *(int *)(pDVar14 + 0x2c)) {
    lVar24 = 0;
    lVar21 = 0;
    do {
      pFVar9 = FieldGeneratorMap::get
                         (local_160,(FieldDescriptor *)(*(long *)(pDVar14 + 0x30) + lVar24));
      (*pFVar9->_vptr_FieldGenerator[6])(pFVar9,printer);
      lVar21 = lVar21 + 1;
      pDVar14 = this->descriptor_;
      lVar24 = lVar24 + 0xa8;
    } while (lVar21 < *(int *)(pDVar14 + 0x2c));
  }
  for (ppOVar19 = (this->oneof_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppOVar19 !=
      (this->oneof_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppOVar19 = ppOVar19 + 1) {
    OneofGenerator::GenerateClearFunctionImplementation(*ppOVar19,printer);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  TextFormatDecodeData::~TextFormatDecodeData(&local_88);
  if ((void *)local_158._0_8_ != (void *)0x0) {
    operator_delete((void *)local_158._0_8_,local_148 - local_158._0_8_);
  }
  if (local_f8.array_ != (FieldDescriptor **)0x0) {
    operator_delete__(local_f8.array_);
  }
  if (local_130.array_ != (FieldDescriptor **)0x0) {
    operator_delete__(local_130.array_);
  }
LAB_0027ed69:
  for (ppEVar25 = (this->enum_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppEVar25 !=
      (this->enum_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppEVar25 = ppEVar25 + 1) {
    EnumGenerator::GenerateSource(*ppEVar25,printer);
  }
  for (ppMVar26 = (this->nested_message_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppMVar26 !=
      (this->nested_message_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar26 = ppMVar26 + 1) {
    GenerateSource(*ppMVar26,printer);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSource(io::Printer* printer) {
  if (!IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "#pragma mark - $classname$\n"
        "\n",
        "classname", class_name_);

    if (!deprecated_attribute_.empty()) {
      // No warnings when compiling the impl of this deprecated class.
      printer->Print(
          "#pragma clang diagnostic push\n"
          "#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n"
          "\n");
    }

    printer->Print("@implementation $classname$\n\n",
                   "classname", class_name_);

    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GeneratePropertyImplementation(printer);
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GeneratePropertyImplementation(printer);
    }

    scoped_array<const FieldDescriptor*> sorted_fields(
        SortFieldsByNumber(descriptor_));
    scoped_array<const FieldDescriptor*> size_order_fields(
        SortFieldsByStorageSize(descriptor_));

    vector<const Descriptor::ExtensionRange*> sorted_extensions;
    for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
      sorted_extensions.push_back(descriptor_->extension_range(i));
    }

    sort(sorted_extensions.begin(), sorted_extensions.end(),
         ExtensionRangeOrdering());

    // Assign has bits:
    // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
    //    who needs has bits and assigning them.
    // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
    //    index that groups all the elements in the oneof.
    size_t num_has_bits = field_generators_.CalculateHasBits();
    size_t sizeof_has_storage = (num_has_bits + 31) / 32;
    if (sizeof_has_storage == 0) {
      // In the case where no field needs has bits, don't let the _has_storage_
      // end up as zero length (zero length arrays are sort of a grey area
      // since it has to be at the start of the struct). This also ensures a
      // field with only oneofs keeps the required negative indices they need.
      sizeof_has_storage = 1;
    }
    // Tell all the fields the oneof base.
    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->SetOneofIndexBase(sizeof_has_storage);
    }
    field_generators_.SetOneofIndexBase(sizeof_has_storage);
    // sizeof_has_storage needs enough bits for the single fields that aren't in
    // any oneof, and then one int32 for each oneof (to store the field number).
    sizeof_has_storage += descriptor_->oneof_decl_count();

    printer->Print(
        "\n"
        "typedef struct $classname$__storage_ {\n"
        "  uint32_t _has_storage_[$sizeof_has_storage$];\n",
        "classname", class_name_,
        "sizeof_has_storage", SimpleItoa(sizeof_has_storage));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(size_order_fields[i])
          .GenerateFieldStorageDeclaration(printer);
    }
    printer->Outdent();

    printer->Print("} $classname$__storage_;\n\n", "classname", class_name_);


    printer->Print(
        "// This method is threadsafe because it is initially called\n"
        "// in +initialize for each subclass.\n"
        "+ (GPBDescriptor *)descriptor {\n"
        "  static GPBDescriptor *descriptor = nil;\n"
        "  if (!descriptor) {\n");

    TextFormatDecodeData text_format_decode_data;
    bool has_fields = descriptor_->field_count() > 0;
    bool need_defaults = field_generators_.DoesAnyFieldHaveNonZeroDefault();
    string field_description_type;
    if (need_defaults) {
      field_description_type = "GPBMessageFieldDescriptionWithDefault";
    } else {
      field_description_type = "GPBMessageFieldDescription";
    }
    if (has_fields) {
      printer->Print(
          "    static $field_description_type$ fields[] = {\n",
          "field_description_type", field_description_type);
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        const FieldGenerator& field_generator =
            field_generators_.get(sorted_fields[i]);
        field_generator.GenerateFieldDescription(printer, need_defaults);
        if (field_generator.needs_textformat_name_support()) {
          text_format_decode_data.AddString(sorted_fields[i]->number(),
                                            field_generator.generated_objc_name(),
                                            field_generator.raw_field_name());
        }
      }
      printer->Outdent();
      printer->Outdent();
      printer->Outdent();
      printer->Print(
          "    };\n");
    }

    map<string, string> vars;
    vars["classname"] = class_name_;
    vars["rootclassname"] = root_classname_;
    vars["fields"] = has_fields ? "fields" : "NULL";
    if (has_fields) {
      vars["fields_count"] =
          "(uint32_t)(sizeof(fields) / sizeof(" + field_description_type + "))";
    } else {
      vars["fields_count"] = "0";
    }

    std::vector<string> init_flags;
    if (need_defaults) {
      init_flags.push_back("GPBDescriptorInitializationFlag_FieldsWithDefault");
    }
    if (descriptor_->options().message_set_wire_format()) {
      init_flags.push_back("GPBDescriptorInitializationFlag_WireFormat");
    }
    vars["init_flags"] = BuildFlagsString(FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                                          init_flags);

    printer->Print(
        vars,
        "    GPBDescriptor *localDescriptor =\n"
        "        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n"
        "                                     rootClass:[$rootclassname$ class]\n"
        "                                          file:$rootclassname$_FileDescriptor()\n"
        "                                        fields:$fields$\n"
        "                                    fieldCount:$fields_count$\n"
        "                                   storageSize:sizeof($classname$__storage_)\n"
        "                                         flags:$init_flags$];\n");
    if (oneof_generators_.size() != 0) {
      printer->Print(
          "    static const char *oneofs[] = {\n");
      for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
           iter != oneof_generators_.end(); ++iter) {
        printer->Print(
            "      \"$name$\",\n",
            "name", (*iter)->DescriptorName());
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupOneofs:oneofs\n"
          "                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n"
          "                   firstHasIndex:$first_has_index$];\n",
          "first_has_index", oneof_generators_[0]->HasIndexAsString());
    }
    if (text_format_decode_data.num_entries() != 0) {
      const string text_format_data_str(text_format_decode_data.Data());
      printer->Print(
          "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
          "    static const char *extraTextFormatInfo =");
      static const int kBytesPerLine = 40;  // allow for escaping
      for (int i = 0; i < text_format_data_str.size(); i += kBytesPerLine) {
        printer->Print(
            "\n        \"$data$\"",
            "data", EscapeTrigraphs(
                CEscape(text_format_data_str.substr(i, kBytesPerLine))));
      }
      printer->Print(
          ";\n"
          "    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n"
          "#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n");
    }
    if (sorted_extensions.size() != 0) {
      printer->Print(
          "    static const GPBExtensionRange ranges[] = {\n");
      for (int i = 0; i < sorted_extensions.size(); i++) {
        printer->Print("      { .start = $start$, .end = $end$ },\n",
                       "start", SimpleItoa(sorted_extensions[i]->start),
                       "end", SimpleItoa(sorted_extensions[i]->end));
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupExtensionRanges:ranges\n"
          "                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n");
    }
    if (descriptor_->containing_type() != NULL) {
      string parent_class_name = ClassName(descriptor_->containing_type());
      printer->Print(
          "    [localDescriptor setupContainingMessageClassName:GPBStringifySymbol($parent_name$)];\n",
          "parent_name", parent_class_name);
    }
    string suffix_added;
    ClassName(descriptor_, &suffix_added);
    if (suffix_added.size() > 0) {
      printer->Print(
          "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
          "suffix", suffix_added);
    }
    printer->Print(
        "    NSAssert(descriptor == nil, @\"Startup recursed!\");\n"
        "    descriptor = localDescriptor;\n"
        "  }\n"
        "  return descriptor;\n"
        "}\n\n"
        "@end\n\n");

    if (!deprecated_attribute_.empty()) {
      printer->Print(
          "#pragma clang diagnostic pop\n"
          "\n");
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateCFunctionImplementations(printer);
    }

    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GenerateClearFunctionImplementation(printer);
    }
  }

  for (vector<EnumGenerator*>::iterator iter = enum_generators_.begin();
       iter != enum_generators_.end(); ++iter) {
    (*iter)->GenerateSource(printer);
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateSource(printer);
  }
}